

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256-sw.c
# Opt level: O0

void sha256_sw_write(BinarySink *bs,void *vp,size_t len)

{
  _Bool _Var1;
  sha256_sw *s;
  size_t len_local;
  void *vp_local;
  BinarySink *bs_local;
  
  s = (sha256_sw *)len;
  len_local = (size_t)vp;
  vp_local = bs;
  while (s != (sha256_sw *)0x0) {
    _Var1 = sha256_block_write((sha256_block *)&bs[-4].binarysink_,(void **)&len_local,(size_t *)&s)
    ;
    if (_Var1) {
      sha256_sw_block((uint32_t *)&bs[-5].writefmtv,(uint8_t *)&bs[-4].binarysink_);
    }
  }
  return;
}

Assistant:

static void sha256_sw_write(BinarySink *bs, const void *vp, size_t len)
{
    sha256_sw *s = BinarySink_DOWNCAST(bs, sha256_sw);

    while (len > 0)
        if (sha256_block_write(&s->blk, &vp, &len))
            sha256_sw_block(s->core, s->blk.block);
}